

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx__vsnprintf_callback(char *buff,void *user,int len)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  int iVar7;
  int *piVar8;
  
  iVar1 = len + 1;
  piVar8 = *(int **)((long)user + 8);
  if (piVar8 == (int *)0x0) {
    iVar7 = 0;
    iVar3 = 0;
  }
  else {
    iVar3 = piVar8[-1];
    iVar7 = iVar3 + iVar1;
    if (iVar7 < piVar8[-2]) goto LAB_00108610;
    iVar7 = piVar8[-2] * 2;
  }
  iVar4 = iVar3 + iVar1;
  if (iVar3 + iVar1 < iVar7) {
    iVar4 = iVar7;
  }
  iVar3 = 8;
  if (8 < iVar4) {
    iVar3 = iVar4;
  }
  piVar5 = piVar8 + -2;
  if (piVar8 == (int *)0x0) {
    piVar5 = (int *)0x0;
  }
  piVar5 = (int *)(*(code *)**user)(piVar5,iVar3 + 8,0,
                                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                                    ,"sx__vsnprintf_callback",0x45,(*user)[1]);
  if (piVar5 == (int *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h",
               0x6d);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h"
                      ,0x6d,"Out of memory");
    pcVar2 = (code *)swi(3);
    pcVar6 = (char *)(*pcVar2)();
    return pcVar6;
  }
  *piVar5 = iVar3;
  if (piVar8 == (int *)0x0) {
    piVar5[1] = 0;
  }
  piVar8 = piVar5 + 2;
  *(int **)((long)user + 8) = piVar8;
  iVar7 = iVar1 + piVar5[1];
LAB_00108610:
  piVar8[-1] = iVar7;
  memcpy((void *)((long)*(int *)((long)user + 0x10) + (long)piVar8),(char *)((long)user + 0x14),
         (long)len);
  *(int *)((long)user + 0x10) = *(int *)((long)user + 0x10) + len;
  return (char *)((long)user + 0x14);
}

Assistant:

static char* sx__vsnprintf_callback(char* buff, void* user, int len)
{
    sx_unused(buff);
    sx__printf_ctx* ctx = (sx__printf_ctx*)user;
    int len_ = len + 1;    // Reserve one character for null-termination
    sx_array_add(ctx->alloc, ctx->buff, len_);
    sx_memcpy(ctx->buff + ctx->len, ctx->tmp, len);
    ctx->len += len;
    return ctx->tmp;
}